

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

bool ClipperLib::PointInPolygon(IntPoint *pt,OutPt *pp,bool UseFullInt64Range)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  undefined7 in_register_00000011;
  OutPt *pOVar4;
  long lVar5;
  bool bVar6;
  long lVar7;
  Int128 local_60;
  Int128 local_50;
  Int128 local_40;
  
  if ((int)CONCAT71(in_register_00000011,UseFullInt64Range) == 0) {
    lVar5 = pt->Y;
    bVar6 = false;
    pOVar4 = pp;
    do {
      lVar7 = (pOVar4->pt).Y;
      lVar1 = (pOVar4->prev->pt).Y;
      if (lVar5 < lVar7) {
        if (lVar1 <= lVar5) {
LAB_005d73f2:
          lVar2 = (pOVar4->pt).X;
          bVar6 = (bool)(bVar6 ^ pt->X < (((pOVar4->prev->pt).X - lVar2) * (lVar5 - lVar7)) /
                                         (lVar1 - lVar7) + lVar2);
        }
      }
      else if (lVar5 < lVar1) goto LAB_005d73f2;
      pOVar4 = pOVar4->next;
    } while (pOVar4 != pp);
  }
  else {
    bVar6 = false;
    pOVar4 = pp;
    do {
      lVar5 = pt->Y;
      lVar7 = (pOVar4->prev->pt).Y;
      if (lVar5 < (pOVar4->pt).Y) {
        if (lVar7 <= lVar5) {
LAB_005d730a:
          local_60.lo = (pOVar4->pt).X;
          lVar5 = pt->X - local_60.lo;
          lVar7 = lVar5 >> 0x3f;
          local_60.lo = (pOVar4->prev->pt).X - local_60.lo;
          local_60.hi = local_60.lo >> 0x3f;
          Int128::operator*(&local_40,&local_60);
          Int128::operator/(&local_50,&local_40);
          bVar3 = lVar7 < local_50.hi;
          if (lVar7 == local_50.hi) {
            bVar3 = lVar5 < local_50.lo;
          }
          bVar6 = (bool)(bVar6 ^ bVar3);
        }
      }
      else if (lVar5 < lVar7) goto LAB_005d730a;
      pOVar4 = pOVar4->next;
    } while (pOVar4 != pp);
  }
  return bVar6;
}

Assistant:

bool PointInPolygon(const IntPoint &pt, OutPt *pp, bool UseFullInt64Range)
{
  OutPt *pp2 = pp;
  bool result = false;
  if (UseFullInt64Range) {
    do
    {
      if ((((pp2->pt.Y <= pt.Y) && (pt.Y < pp2->prev->pt.Y)) ||
          ((pp2->prev->pt.Y <= pt.Y) && (pt.Y < pp2->pt.Y))) &&
          Int128(pt.X - pp2->pt.X) < (Int128(pp2->prev->pt.X - pp2->pt.X) *
          Int128(pt.Y - pp2->pt.Y)) / Int128(pp2->prev->pt.Y - pp2->pt.Y))
            result = !result;
      pp2 = pp2->next;
    }
    while (pp2 != pp);
  }
  else
  {
    do
    {
      if ((((pp2->pt.Y <= pt.Y) && (pt.Y < pp2->prev->pt.Y)) ||
        ((pp2->prev->pt.Y <= pt.Y) && (pt.Y < pp2->pt.Y))) &&
        (pt.X < (pp2->prev->pt.X - pp2->pt.X) * (pt.Y - pp2->pt.Y) /
        (pp2->prev->pt.Y - pp2->pt.Y) + pp2->pt.X )) result = !result;
      pp2 = pp2->next;
    }
    while (pp2 != pp);
  }
  return result;
}